

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

web_seed_t * __thiscall
libtorrent::aux::torrent::add_web_seed
          (torrent *this,string *url,string *auth,headers_t *extra_headers,web_seed_flag_t flags)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *this_00;
  _List_iterator<libtorrent::aux::web_seed_t> _Var1;
  web_seed_t *pwVar2;
  web_seed_t ent;
  web_seed_t wStack_128;
  
  web_seed_t::web_seed_t(&wStack_128,url,auth,extra_headers);
  wStack_128.ephemeral = (bool)(flags.m_val & 1);
  wStack_128.no_local_ips = (bool)(flags.m_val >> 1 & 1);
  this_00 = &this->m_web_seeds;
  _Var1 = ::std::
          __find_if<std::_List_iterator<libtorrent::aux::web_seed_t>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::web_seed_t_const>>
                    ((this->m_web_seeds).
                     super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                     ._M_impl._M_node.super__List_node_base._M_next,this_00,&wStack_128);
  if (_Var1._M_node == (_List_node_base *)this_00) {
    ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
    ::emplace_back<libtorrent::aux::web_seed_t>(this_00,&wStack_128);
    if (wStack_128.ephemeral == false) {
      set_need_save_resume(this,(resume_data_flags_t)0x80);
    }
    update_want_tick(this);
    pwVar2 = (web_seed_t *)
             ((this->m_web_seeds).
              super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
              ._M_impl._M_node.super__List_node_base._M_prev + 1);
  }
  else {
    pwVar2 = (web_seed_t *)(_Var1._M_node + 1);
    if ((*(char *)((long)&_Var1._M_node[0xb]._M_next + 4) == '\x01') &&
       (wStack_128.ephemeral == false)) {
      set_need_save_resume(this,(resume_data_flags_t)0x80);
      *(undefined1 *)((long)&_Var1._M_node[0xb]._M_next + 4) = 0;
    }
  }
  web_seed_t::~web_seed_t(&wStack_128);
  return pwVar2;
}

Assistant:

web_seed_t* torrent::add_web_seed(std::string const& url
		, std::string const& auth
		, web_seed_entry::headers_t const& extra_headers
		, web_seed_flag_t const flags)
	{
		web_seed_t ent(url, auth, extra_headers);
		ent.ephemeral = bool(flags & ephemeral);
		ent.no_local_ips = bool(flags & no_local_ips);

		// don't add duplicates
		auto const it = std::find(m_web_seeds.begin(), m_web_seeds.end(), ent);
		if (it != m_web_seeds.end())
		{
			// if we're adding a web seed (as non-ephemeral) and we have an
			// ephemeral web seed already, promote it to non-ephemeral
			if (it->ephemeral && !ent.ephemeral)
			{
				set_need_save_resume(torrent_handle::if_metadata_changed);
				it->ephemeral = false;
			}
			return &*it;
		}
		m_web_seeds.emplace_back(std::move(ent));

		// ephemeral web seeds are not saved in the resume data
		if (!ent.ephemeral)
			set_need_save_resume(torrent_handle::if_metadata_changed);

		update_want_tick();
		return &m_web_seeds.back();
	}